

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteBuiltin_db_get_schema(jx9_context *pCtx,int argc,jx9_value **argv)

{
  unqlite_col *puVar1;
  int iFlag;
  char *zErr;
  int nByte;
  SyString sName;
  
  if (argc < 1) {
    zErr = "Missing collection name and/or db scheme";
  }
  else {
    sName.zString = jx9_value_to_string(*argv,&nByte);
    if (0 < nByte) {
      sName.nByte = nByte;
      puVar1 = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&sName,iFlag);
      if (puVar1 != (unqlite_col *)0x0) {
        jx9_result_value(pCtx,&puVar1->sSchema);
        return 0;
      }
      jx9_context_throw_error_format(pCtx,2,"No such collection \'%z\'",&sName);
      jx9_result_null(pCtx);
      return 0;
    }
    zErr = "Invalid collection name";
  }
  jx9_context_throw_error(pCtx,1,zErr);
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int unqliteBuiltin_db_get_schema(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name and/or db scheme");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		/* Return the collection schema */
		jx9_result_value(pCtx,&pCol->sSchema);
	}else{
		jx9_context_throw_error_format(pCtx,JX9_CTX_WARNING,
			"No such collection '%z'",
			&sName
			);
		jx9_result_null(pCtx);
	}
	return JX9_OK;
}